

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

int fl_XGetUtf8FontAndGlyph(XUtf8FontStruct *font_set,uint ucs,XFontStruct **fnt,unsigned_short *id)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  XFontStruct **ppXVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  char glyph [2];
  ushort local_6a;
  XFontStruct **local_68;
  ulong local_60;
  int *local_58;
  ushort *local_50;
  XFontStruct **local_48;
  int *local_40;
  int *local_38;
  
  iVar4 = font_set->nb_font;
  uVar5 = (ulong)iVar4;
  iVar1 = -1;
  if (0 < (long)uVar5) {
    piVar3 = font_set->encodings;
    ppXVar6 = font_set->fonts;
    if (*ppXVar6 == (XFontStruct *)0x0) {
      uVar2 = 0;
      do {
        if (uVar5 - 1 == uVar2) {
          return -1;
        }
        uVar9 = uVar2 + 1;
        lVar7 = uVar2 + 1;
        uVar2 = uVar9;
      } while (ppXVar6[lVar7] == (XFontStruct *)0x0);
      bVar10 = uVar9 < uVar5;
    }
    else {
      bVar10 = true;
      uVar9 = 0;
    }
    iVar1 = -1;
    if (bVar10) {
      iVar8 = (int)uVar9;
      iVar1 = iVar8;
      if (iVar8 < iVar4) {
        local_38 = piVar3 + uVar9;
        local_40 = font_set->ranges + uVar9 * 2 + 1;
        lVar7 = 0;
        local_68 = ppXVar6;
        local_60 = uVar5;
        local_58 = piVar3;
        local_50 = id;
        local_48 = fnt;
        do {
          if (ppXVar6[uVar9 + lVar7] != (XFontStruct *)0x0) {
            iVar4 = local_38[lVar7];
            iVar1 = ucs2fontmap((char *)&local_6a,ucs,iVar4);
            if ((-1 < iVar1) &&
               ((iVar4 != 0 ||
                ((local_40[lVar7 * 2 + -1] <= (int)ucs && ((int)ucs <= local_40[lVar7 * 2])))))) {
              iVar1 = (int)lVar7 + iVar8;
              iVar4 = (int)local_60;
              fnt = local_48;
              piVar3 = local_58;
              id = local_50;
              ppXVar6 = local_68;
              goto LAB_001a6c85;
            }
          }
          lVar7 = lVar7 + 1;
        } while ((uVar9 - uVar5) + lVar7 != 0);
        iVar4 = (int)local_60;
        fnt = local_48;
        piVar3 = local_58;
        id = local_50;
        ppXVar6 = local_68;
        iVar1 = iVar4;
      }
LAB_001a6c85:
      if (iVar1 == iVar4) {
        ucs2fontmap((char *)&local_6a,0x3f,piVar3[uVar9 & 0xffffffff]);
        iVar1 = iVar8;
      }
      *id = local_6a << 8 | local_6a >> 8;
      *fnt = ppXVar6[iVar1];
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
fl_XGetUtf8FontAndGlyph(XUtf8FontStruct  *font_set,
			unsigned int     ucs,
			XFontStruct      **fnt,
			unsigned short   *id) {

  int             *encodings; /* encodings array */
  XFontStruct     **fonts;    /* fonts array */
  int             fnum;       /* index of the current font in the fonts array*/
  int             first;      /* first valid font index */
  int             nb_font;    /* quantity of fonts in the font array */
  char 		  glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int             *ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return -1;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return -1;
  }

  first = fnum;

  /*
   * find the first encoding which can be used to draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 ||
          ((int)ucs >= ranges[fnum * 2] &&
	   (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  *id = ((unsigned char)glyph[0] << 8) | (unsigned char)glyph[1] ;
  *fnt = fonts[fnum];
  return 0;
}